

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall image_u8::image_u8(image_u8 *this,uint32_t width,uint32_t height)

{
  (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_width = width;
  this->m_height = height;
  std::vector<color_quad_u8,_std::allocator<color_quad_u8>_>::resize
            (&this->m_pixels,(ulong)(width * height));
  return;
}

Assistant:

image_u8(uint32_t width, uint32_t height) :
		m_width(width), m_height(height)
	{
		m_pixels.resize(width * height);
	}